

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::DecimalFormat
          (DecimalFormat *this,UnicodeString *pattern,DecimalFormatSymbols *symbols,
          UErrorCode *status)

{
  DecimalFormatSymbols *this_00;
  undefined8 local_48;
  UErrorCode *status_local;
  DecimalFormatSymbols *symbols_local;
  UnicodeString *pattern_local;
  DecimalFormat *this_local;
  
  this_00 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)pattern);
  local_48 = (DecimalFormatSymbols *)0x0;
  if (this_00 != (DecimalFormatSymbols *)0x0) {
    DecimalFormatSymbols::DecimalFormatSymbols(this_00,symbols);
    local_48 = this_00;
  }
  DecimalFormat(this,local_48,status);
  setPropertiesFromPattern(this,pattern,1,status);
  touch(this,status);
  return;
}

Assistant:

DecimalFormat::DecimalFormat(const UnicodeString& pattern, const DecimalFormatSymbols& symbols,
                             UErrorCode& status)
        : DecimalFormat(new DecimalFormatSymbols(symbols), status) {
    setPropertiesFromPattern(pattern, IGNORE_ROUNDING_IF_CURRENCY, status);
    touch(status);
}